

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O2

void __thiscall
senjo::MoveFinder::AddOrigins
          (MoveFinder *this,char pc,int x,int y,
          set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins)

{
  ulong uVar1;
  char (*pacVar2) [8];
  long lVar3;
  int iVar4;
  ulong uVar5;
  Square local_3c;
  _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
  *local_38;
  
  pacVar2 = this->board;
  local_38 = &origins->_M_t;
  if ((uint)x < 8) {
    if ((uint)y < 8) {
      if (pacVar2[(uint)x][(uint)y] == pc) {
        local_3c.sqr = y << 4 | x;
        std::
        _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
        ::_M_insert_unique<senjo::Square>(&origins->_M_t,&local_3c);
      }
    }
    else {
      iVar4 = x;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        if (this->board[(uint)x][lVar3] == pc) {
          local_3c.sqr = 0x78;
          if (((uint)lVar3 | x) < 8) {
            local_3c.sqr = iVar4;
          }
          std::
          _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
          ::_M_insert_unique<senjo::Square>(local_38,&local_3c);
        }
        iVar4 = iVar4 + 0x10;
      }
    }
  }
  else if ((uint)y < 8) {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      if (this->board[lVar3][(uint)y] == pc) {
        local_3c.sqr = y << 4 | (uint)lVar3;
        if (7 < ((uint)lVar3 | y)) {
          local_3c.sqr = 0x78;
        }
        std::
        _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
        ::_M_insert_unique<senjo::Square>(local_38,&local_3c);
      }
    }
  }
  else {
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      uVar1 = uVar5 & 0xffffffff;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        if ((*pacVar2)[lVar3] == pc) {
          local_3c.sqr = 0x78;
          if ((((uint)lVar3 | (uint)uVar5) & 0xfffffff8) == 0) {
            local_3c.sqr = (int)uVar1;
          }
          std::
          _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
          ::_M_insert_unique<senjo::Square>(local_38,&local_3c);
        }
        uVar1 = (ulong)((int)uVar1 + 0x10);
      }
      pacVar2 = pacVar2 + 1;
    }
  }
  return;
}

Assistant:

void MoveFinder::AddOrigins(const char pc, int x, int y,
                            std::set<Square>& origins) const
{
  if ((x >= 0) && (x < 8)) {
    if ((y >= 0) && (y < 8)) {
      if (board[x][y] == pc) {
        origins.insert(Square(x, y));
      }
    }
    else {
      for (y = 0; y < 8; ++y) {
        if (board[x][y] == pc) {
          origins.insert(Square(x, y));
        }
      }
    }
  }
  else if ((y >= 0) && (y < 8)) {
    for (x = 0; x < 8; ++x) {
      if (board[x][y] == pc) {
        origins.insert(Square(x, y));
      }
    }
  }
  else {
    for (x = 0; x < 8; ++x) {
      for (y = 0; y < 8; ++y) {
        if (board[x][y] == pc) {
          origins.insert(Square(x, y));
        }
      }
    }
  }
}